

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2_custom_app_return_codes_with_messages.cpp
# Opt level: O3

int main(void)

{
  logic_error *this;
  
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"std::exception!");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

int main() try // Function try block
{
   //throw_int();
   throw_std_exception();
   //throw_bad_alloc();

	return EXIT_SUCCESS;
}
catch (...)
{
   using namespace mittens;
   return   all_catcher(             -1, []()                { std::cout << "Caught unhandled exception of unknown type!"   << std::endl; }, 
               std_exception_handler(-2, [](auto& e){ std::cout << "Caught unhandled std::exception: " << e.what() << std::endl; },
                  bad_alloc_handler( -3, [](auto& e){ std::cout << "Caught unhandled std::bad_alloc: " << e.what() << std::endl; }))).
                     handleException(); 
}